

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

void __thiscall psy::C::Lexer::lexIntegerOrFloatingConstant(Lexer *this,SyntaxToken *tk)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  ParseOptions *this_00;
  LanguageDialect *pLVar4;
  int iVar5;
  allocator<char> local_41;
  string local_40;
  
  iVar5 = (int)this->yytext_ + -1;
  if ((this->yytext_[-1] == '0') && (bVar1 = this->yychar_, bVar1 != 0)) {
    if (bVar1 != 0x42) {
      if ((bVar1 == 0x58) || (bVar1 == 0x78)) {
        yyinput(this);
        lexHexadecimalDigitSequence(this);
        if (this->yychar_ == '.') {
          tk->syntaxK_ = FloatingConstantToken;
          yyinput(this);
          this_00 = SyntaxTree::parseOptions(this->tree_);
          pLVar4 = ParseOptions::languageDialect(this_00);
          bVar2 = operator<(pLVar4->std_,C99);
          if (bVar2) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_40,"hexadecimal floating-point constant",&local_41);
            DiagnosticsReporter::IncompatibleLanguageDialect(&this->diagReporter_,&local_40,C99);
            std::__cxx11::string::~string((string *)&local_40);
          }
          lexHexadecimalDigitSequence(this);
          lexBinaryExponentPart(this);
          lexFloatingOrImaginaryFloatingSuffix(this,tk,*(int *)&this->yytext_ - iVar5);
          return;
        }
        goto LAB_002e3d29;
      }
      if (bVar1 != 0x62) {
        if ((bVar1 & 0xf8) == 0x30) {
          do {
            yyinput(this);
          } while ((this->yychar_ & 0xf8) == 0x30);
          goto LAB_002e3d29;
        }
        goto LAB_002e3d46;
      }
    }
    do {
      yyinput(this);
    } while ((this->yychar_ & 0xfe) == 0x30);
  }
  else {
LAB_002e3d46:
    while (this->yychar_ != 0) {
      uVar3 = (uint)this->yychar_;
      if ((uVar3 == 0x65) || (uVar3 == 0x45)) {
        lexFloatingOrImaginaryFloating_AtExponent(this,tk,*(int *)&this->yytext_ - iVar5);
        return;
      }
      if (uVar3 == 0x2e) {
        yyinput(this);
        lexFloatingOrImaginaryFloating_AtFollowOfPeriod(this,tk,*(int *)&this->yytext_ - iVar5);
        return;
      }
      if (9 < uVar3 - 0x30) break;
      yyinput(this);
    }
  }
LAB_002e3d29:
  lexIntegerOrImaginaryIntegerSuffix(this,tk,*(int *)&this->yytext_ - iVar5);
  return;
}

Assistant:

void Lexer::lexIntegerOrFloatingConstant(SyntaxToken* tk)
{
    const char* yytext = yytext_ - 1;

    if (*yytext == '0' && yychar_) {
        if (yychar_ == 'x'|| yychar_ == 'X') {
            yyinput();
            lexHexadecimalDigitSequence();

            if (yychar_ == '.') {
                tk->syntaxK_ = SyntaxKind::FloatingConstantToken;
                yyinput();

                if (tree_->parseOptions().languageDialect().std() < LanguageDialect::Std::C99) {
                    diagReporter_.IncompatibleLanguageDialect(
                                "hexadecimal floating-point constant",
                                LanguageDialect::Std::C99);
                }

                lexHexadecimalDigitSequence();
                lexBinaryExponentPart();
                lexFloatingOrImaginaryFloatingSuffix(tk, yytext_ - yytext);
                return;
            }
            lexIntegerOrImaginaryIntegerSuffix(tk, yytext_ - yytext);
            return;
        }

        if (yychar_ == 'b' || yychar_ == 'B') {
            yyinput();
            while (yychar_ == '0' || yychar_ == '1')
                yyinput();
            lexIntegerOrImaginaryIntegerSuffix(tk, yytext_ - yytext);
            return;
        }

        if (yychar_ >= '0' && yychar_ <= '7') {
            do {
                yyinput();
            }
            while (yychar_ >= '0' && yychar_ <= '7');

            lexIntegerOrImaginaryIntegerSuffix(tk, yytext_ - yytext);
            return;
        }
    }

    while (yychar_) {
        if (yychar_ == '.') {
            yyinput();
            lexFloatingOrImaginaryFloating_AtFollowOfPeriod(tk, yytext_ - yytext);
            return;
        }

        if (yychar_ == 'e' || yychar_ == 'E') {
            lexFloatingOrImaginaryFloating_AtExponent(tk, yytext_ - yytext);
            return;
        }

        if (!std::isdigit(yychar_))
            break;
        yyinput();
    }

    lexIntegerOrImaginaryIntegerSuffix(tk, yytext_ - yytext);
}